

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FArrayBox.cpp
# Opt level: O0

void __thiscall amrex::FABio_ascii::skip(FABio_ascii *this,istream *is,FArrayBox *f)

{
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  FABio_ascii *in_RDI;
  
  read(in_RDI,in_ESI,in_RDX,in_RCX);
  return;
}

Assistant:

void
FABio_ascii::skip (std::istream& is,
                   FArrayBox&    f) const
{
#ifdef AMREX_USE_GPU
    if (f.arena()->isManaged() || f.arena()->isDevice()) {
        FArrayBox hostfab(f.box(), f.nComp(), The_Pinned_Arena());
        FABio_ascii::read(is, hostfab);
        Gpu::htod_memcpy_async(f.dataPtr(), hostfab.dataPtr(), f.size()*sizeof(Real));
        Gpu::streamSynchronize();
    } else
#endif
    {
        FABio_ascii::read(is, f);
    }
}